

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# izamax.c
# Opt level: O0

integer izamax_(integer *n,doublecomplex *zx,integer *incx)

{
  doublereal dVar1;
  int local_40;
  int local_3c;
  integer ix;
  integer i;
  doublereal smax;
  integer i__1;
  integer ret_val;
  integer *incx_local;
  doublecomplex *zx_local;
  integer *n_local;
  
  if ((*n < 1) || (*incx < 1)) {
    n_local._4_4_ = 0;
  }
  else {
    smax._4_4_ = 1;
    if (*n == 1) {
      n_local._4_4_ = 1;
    }
    else if (*incx == 1) {
      _ix = dcabs1_(zx);
      for (local_3c = 2; local_3c <= *n; local_3c = local_3c + 1) {
        dVar1 = dcabs1_(zx + (local_3c + -1));
        if (_ix < dVar1) {
          smax._4_4_ = local_3c;
          _ix = dcabs1_(zx + (local_3c + -1));
        }
      }
      n_local._4_4_ = smax._4_4_;
    }
    else {
      _ix = dcabs1_(zx);
      local_40 = *incx + 1;
      for (local_3c = 2; local_3c <= *n; local_3c = local_3c + 1) {
        dVar1 = dcabs1_(zx + (local_40 + -1));
        if (_ix < dVar1) {
          smax._4_4_ = local_3c;
          _ix = dcabs1_(zx + (local_40 + -1));
        }
        local_40 = *incx + local_40;
      }
      n_local._4_4_ = smax._4_4_;
    }
  }
  return n_local._4_4_;
}

Assistant:

integer izamax_(integer *n, doublecomplex *zx, integer *incx)
{


    /* System generated locals */
integer ret_val, i__1;

    /* Local variables */
    doublereal smax;
    integer i;
    extern doublereal dcabs1_(doublecomplex *);
    integer ix;


/*     finds the index of element having max. absolute value.   
       jack dongarra, 1/15/85.   
       modified 3/93 to return if incx .le. 0.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define ZX(I) zx[(I)-1]


    ret_val = 0;
    if (*n < 1 || *incx <= 0) {
	return ret_val;
    }
    ret_val = 1;
    if (*n == 1) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L20;
    }

/*        code for increment not equal to 1 */

    ix = 1;
    smax = dcabs1_(&ZX(1));
    ix += *incx;
    for (i = 2; i <= *n; ++i) {
	if (dcabs1_(&ZX(ix)) <= smax) {
	    goto L5;
	}
	ret_val = i;
	smax = dcabs1_(&ZX(ix));
L5:
	ix += *incx;
/* L10: */
    }
    return ret_val;

/*        code for increment equal to 1 */

L20:
    smax = dcabs1_(&ZX(1));
    for (i = 2; i <= *n; ++i) {
	if (dcabs1_(&ZX(i)) <= smax) {
	    goto L30;
	}
	ret_val = i;
	smax = dcabs1_(&ZX(i));
L30:
	;
    }
    return ret_val;
}